

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

Aig_Man_t * Saig_ManDupInitZero(Aig_Man_t *p)

{
  char *__s;
  Aig_Man_t *p_00;
  size_t sVar1;
  char *__dest;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *p1;
  int iVar6;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  __s = p->pName;
  iVar6 = 0;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar1 = strlen(__s);
    __dest = (char *)malloc(sVar1 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (; iVar6 < p->nTruePis; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar6);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar6);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(ulong *)((long)pvVar2 + 0x28) =
         (ulong)(*(uint *)((long)pvVar2 + 0x18) >> 4 & 1) ^ (ulong)pAVar3;
  }
  for (iVar6 = 0; iVar6 < p->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar6);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      if (((ulong)pAVar3 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar5 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pAVar3->pFanin1 & 1) ^ *(ulong *)(uVar5 + 0x28));
      }
      pAVar4 = Aig_And(p_00,pAVar4,p1);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  for (iVar6 = 0; iVar6 < p->nTruePos; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar6);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
    (pAVar3->field_5).pData = pAVar4;
  }
  for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar6);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                  ((ulong)(*(uint *)&pAVar3->field_0x18 >> 4 & 1) ^ (ulong)pAVar4));
    (pAVar3->field_5).pData = pAVar4;
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  if (p_00->nObjs[6] + p_00->nObjs[5] == p->nObjs[6] + p->nObjs[5]) {
    return p_00;
  }
  __assert_fail("Aig_ManNodeNum(pNew) == Aig_ManNodeNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                ,0x1e7,"Aig_Man_t *Saig_ManDupInitZero(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Saig_ManDupInitZero( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachLo( p, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi( pNew ), pObj->fMarkA );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Saig_ManForEachPo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond( Aig_ObjChild0Copy(pObj), pObj->fMarkA ) );
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p) );
    assert( Aig_ManNodeNum(pNew) == Aig_ManNodeNum(p) );
    return pNew;
}